

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::BuildMeshRefCountArray
          (PretransformVertices *this,aiNode *nd,uint *refs)

{
  uint i;
  ulong uVar1;
  uint i_1;
  
  for (uVar1 = 0; uVar1 < nd->mNumMeshes; uVar1 = uVar1 + 1) {
    refs[nd->mMeshes[uVar1]] = refs[nd->mMeshes[uVar1]] + 1;
  }
  for (uVar1 = 0; uVar1 < nd->mNumChildren; uVar1 = uVar1 + 1) {
    BuildMeshRefCountArray(this,nd->mChildren[uVar1],refs);
  }
  return;
}

Assistant:

void PretransformVertices::BuildMeshRefCountArray(aiNode* nd, unsigned int * refs)
{
    for (unsigned int i = 0; i< nd->mNumMeshes;++i)
        refs[nd->mMeshes[i]]++;

    // call children
    for (unsigned int i = 0; i < nd->mNumChildren;++i)
        BuildMeshRefCountArray(nd->mChildren[i],refs);
}